

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O3

REF_STATUS ref_fixture_tri2_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  int iVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  REF_INT RVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  char *pcVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  REF_INT cell;
  REF_INT local [27];
  REF_INT local_9c;
  int local_98;
  int local_94;
  REF_INT local_90 [28];
  
  uVar4 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar4 != 0) {
    uVar17 = (ulong)uVar4;
    pcVar14 = "create";
    uVar6 = 0x1a1;
    goto LAB_001129df;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node = pRVar1->node;
  pRVar1->twod = 1;
  iVar9 = ref_mpi->n;
  iVar5 = ref_mpi->id;
  iVar7 = 0;
  iVar13 = (int)(3 / (long)iVar9);
  iVar15 = iVar13 * iVar9;
  if (3 < iVar15) {
    iVar7 = ((((iVar9 + 3) / iVar9) * (iVar15 + -4)) / iVar13 - iVar15) + 4;
  }
  if (iVar5 == iVar7) {
LAB_00111f8e:
    uVar4 = ref_node_add(ref_node,0,&local_98);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar14 = "add node";
      uVar6 = 0x1b1;
      goto LAB_001129df;
    }
    pRVar2 = ref_node->real;
    lVar12 = (long)local_98;
    pRVar3 = pRVar2 + lVar12 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar12 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar12) && (local_98 < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar11 = ref_node->global[lVar12];
    }
    iVar9 = ref_mpi->n;
    iVar5 = (iVar9 + 3) / iVar9;
    if (lVar11 / (long)iVar5 < (long)(ulong)((int)(3 % (long)iVar9) + 1)) {
      lVar11 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar11 = ref_node->global[lVar12];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar5);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar11 = ref_node->global[lVar12];
        }
      }
      iVar13 = (int)(3 / (long)iVar9);
      iVar9 = 4 - iVar9 * iVar13;
      RVar10 = iVar9 + (int)((lVar11 - iVar5 * iVar9) / (long)iVar13);
    }
    ref_node->part[lVar12] = RVar10;
    uVar4 = ref_node_add(ref_node,1,&local_94);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar14 = "add node";
      uVar6 = 0x1b2;
      goto LAB_001129df;
    }
    pRVar2 = ref_node->real;
    lVar12 = (long)local_94;
    pRVar3 = pRVar2 + lVar12 * 0xf;
    *(undefined4 *)pRVar3 = 0;
    *(undefined4 *)((long)pRVar3 + 4) = 0;
    *(undefined4 *)(pRVar3 + 1) = 0;
    *(undefined4 *)((long)pRVar3 + 0xc) = 0x3ff00000;
    pRVar2[lVar12 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar12) && (local_94 < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar11 = ref_node->global[lVar12];
    }
    iVar9 = ref_mpi->n;
    iVar5 = (iVar9 + 3) / iVar9;
    if (lVar11 / (long)iVar5 < (long)(ulong)((int)(3 % (long)iVar9) + 1)) {
      lVar11 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar11 = ref_node->global[lVar12];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar5);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar11 = ref_node->global[lVar12];
        }
      }
      iVar13 = (int)(3 / (long)iVar9);
      iVar9 = 4 - iVar9 * iVar13;
      RVar10 = iVar9 + (int)((lVar11 - iVar5 * iVar9) / (long)iVar13);
    }
    ref_node->part[lVar12] = RVar10;
    uVar4 = ref_node_add(ref_node,2,local_90);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar14 = "add node";
      uVar6 = 0x1b3;
      goto LAB_001129df;
    }
    pRVar3 = ref_node->real;
    lVar12 = (long)local_90[0];
    pRVar3[lVar12 * 0xf] = 1.0;
    pRVar3 = pRVar3 + lVar12 * 0xf + 1;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar12) && (local_90[0] < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar11 = ref_node->global[lVar12];
    }
    iVar9 = ref_mpi->n;
    iVar5 = (iVar9 + 3) / iVar9;
    if (lVar11 / (long)iVar5 < (long)(ulong)((int)(3 % (long)iVar9) + 1)) {
      lVar11 = -1;
      if ((-1 < local_90[0]) && (local_90[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar11 = ref_node->global[lVar12];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar5);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_90[0]) && (local_90[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar11 = ref_node->global[lVar12];
        }
      }
      iVar13 = (int)(3 / (long)iVar9);
      iVar9 = 4 - iVar9 * iVar13;
      RVar10 = iVar9 + (int)((lVar11 - iVar5 * iVar9) / (long)iVar13);
    }
    ref_node->part[lVar12] = RVar10;
    uVar4 = ref_cell_add(pRVar1->cell[3],&local_98,&local_9c);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar14 = "add tri";
      uVar6 = 0x1b5;
      goto LAB_001129df;
    }
    iVar9 = ref_mpi->n;
    iVar5 = ref_mpi->id;
    iVar13 = (int)(3 / (long)iVar9);
    iVar15 = iVar13 * iVar9;
  }
  else {
    iVar8 = (iVar9 + 3) / iVar9;
    iVar7 = 0;
    if (iVar8 + 1U < 3) {
      iVar7 = iVar8;
    }
    iVar16 = 4 - iVar15;
    if (iVar16 <= iVar7) {
      iVar7 = (1 - iVar8 * iVar16) / iVar13 + iVar16;
    }
    if (iVar5 == iVar7) goto LAB_00111f8e;
    iVar7 = (int)(2 / (long)iVar8);
    if (iVar16 <= iVar7) {
      iVar7 = (2 - iVar8 * iVar16) / iVar13 + iVar16;
    }
    if (iVar5 == iVar7) goto LAB_00111f8e;
  }
  iVar7 = 0;
  if (3 < iVar15) {
    iVar7 = ((((iVar9 + 3) / iVar9) * (iVar15 + -4)) / iVar13 - iVar15) + 4;
  }
  if (iVar5 == iVar7) {
LAB_001123f5:
    uVar4 = ref_node_add(ref_node,0,&local_98);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar14 = "add node";
      uVar6 = 0x1c2;
      goto LAB_001129df;
    }
    pRVar2 = ref_node->real;
    lVar12 = (long)local_98;
    pRVar3 = pRVar2 + lVar12 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[lVar12 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar12) && (local_98 < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar11 = ref_node->global[lVar12];
    }
    iVar9 = ref_mpi->n;
    iVar5 = (iVar9 + 3) / iVar9;
    if (lVar11 / (long)iVar5 < (long)(ulong)((int)(3 % (long)iVar9) + 1)) {
      lVar11 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar11 = ref_node->global[lVar12];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar5);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_98) && (local_98 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar11 = ref_node->global[lVar12];
        }
      }
      iVar13 = (int)(3 / (long)iVar9);
      iVar9 = 4 - iVar9 * iVar13;
      RVar10 = iVar9 + (int)((lVar11 - iVar5 * iVar9) / (long)iVar13);
    }
    ref_node->part[lVar12] = RVar10;
    uVar4 = ref_node_add(ref_node,3,&local_94);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar14 = "add node";
      uVar6 = 0x1c3;
      goto LAB_001129df;
    }
    pRVar3 = ref_node->real;
    lVar12 = (long)local_94;
    pRVar3[lVar12 * 0xf] = -1.0;
    pRVar3 = pRVar3 + lVar12 * 0xf + 1;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar12) && (local_94 < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar11 = ref_node->global[lVar12];
    }
    iVar9 = ref_mpi->n;
    iVar5 = (iVar9 + 3) / iVar9;
    if (lVar11 / (long)iVar5 < (long)(ulong)((int)(3 % (long)iVar9) + 1)) {
      lVar11 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar11 = ref_node->global[lVar12];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar5);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_94) && (local_94 < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar11 = ref_node->global[lVar12];
        }
      }
      iVar13 = (int)(3 / (long)iVar9);
      iVar9 = 4 - iVar9 * iVar13;
      RVar10 = iVar9 + (int)((lVar11 - iVar5 * iVar9) / (long)iVar13);
    }
    ref_node->part[lVar12] = RVar10;
    uVar4 = ref_node_add(ref_node,1,local_90);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar14 = "add node";
      uVar6 = 0x1c4;
      goto LAB_001129df;
    }
    pRVar2 = ref_node->real;
    lVar12 = (long)local_90[0];
    pRVar3 = pRVar2 + lVar12 * 0xf;
    *(undefined4 *)pRVar3 = 0;
    *(undefined4 *)((long)pRVar3 + 4) = 0;
    *(undefined4 *)(pRVar3 + 1) = 0;
    *(undefined4 *)((long)pRVar3 + 0xc) = 0x3ff00000;
    pRVar2[lVar12 * 0xf + 2] = 0.0;
    lVar11 = -1;
    if (((-1 < lVar12) && (local_90[0] < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar11 = ref_node->global[lVar12];
    }
    iVar9 = ref_mpi->n;
    iVar5 = (iVar9 + 3) / iVar9;
    if (lVar11 / (long)iVar5 < (long)(ulong)((int)(3 % (long)iVar9) + 1)) {
      lVar11 = -1;
      if ((-1 < local_90[0]) && (local_90[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar11 = ref_node->global[lVar12];
        }
      }
      RVar10 = (REF_INT)(lVar11 / (long)iVar5);
    }
    else {
      lVar11 = -1;
      if ((-1 < local_90[0]) && (local_90[0] < ref_node->max)) {
        lVar11 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar11 = ref_node->global[lVar12];
        }
      }
      iVar13 = (int)(3 / (long)iVar9);
      iVar9 = 4 - iVar9 * iVar13;
      RVar10 = iVar9 + (int)((lVar11 - iVar5 * iVar9) / (long)iVar13);
    }
    ref_node->part[lVar12] = RVar10;
    uVar4 = ref_cell_add(pRVar1->cell[3],&local_98,&local_9c);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar14 = "add tri";
      uVar6 = 0x1c6;
      goto LAB_001129df;
    }
  }
  else {
    iVar9 = (iVar9 + 3) / iVar9;
    iVar7 = (int)(3 / (long)iVar9);
    iVar15 = 4 - iVar15;
    if (iVar15 <= iVar7) {
      iVar7 = (3 - iVar9 * iVar15) / iVar13 + iVar15;
    }
    if (iVar5 == iVar7) goto LAB_001123f5;
    iVar7 = 0;
    if (iVar9 + 1U < 3) {
      iVar7 = iVar9;
    }
    if (iVar15 <= iVar7) {
      iVar7 = (1 - iVar9 * iVar15) / iVar13 + iVar15;
    }
    if (iVar5 == iVar7) goto LAB_001123f5;
  }
  uVar4 = ref_node_initialize_n_global(ref_node,4);
  if (uVar4 != 0) {
    uVar17 = (ulong)uVar4;
    pcVar14 = "init glob";
    uVar6 = 0x1c9;
    goto LAB_001129df;
  }
  iVar9 = ref_mpi->n;
  iVar5 = ref_mpi->id;
  iVar15 = 0;
  iVar7 = (int)(3 / (long)iVar9);
  iVar13 = iVar7 * iVar9;
  if (3 < iVar13) {
    iVar15 = ((((iVar9 + 3) / iVar9) * (iVar13 + -4)) / iVar7 - iVar13) + 4;
  }
  if (iVar5 == iVar15) {
LAB_0011286d:
    uVar4 = ref_node_local(ref_node,0,&local_98);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar14 = "loc";
      uVar6 = 0x1d2;
      goto LAB_001129df;
    }
    uVar4 = ref_node_local(ref_node,2,&local_94);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar14 = "loc";
      uVar6 = 0x1d3;
      goto LAB_001129df;
    }
    local_90[0] = 10;
    uVar4 = ref_cell_add(pRVar1->cell[0],&local_98,&local_9c);
    if (uVar4 != 0) {
      uVar17 = (ulong)uVar4;
      pcVar14 = "add edg";
      uVar6 = 0x1d5;
      goto LAB_001129df;
    }
    iVar13 = ref_mpi->n;
    iVar5 = ref_mpi->id;
    iVar9 = (iVar13 + 3) / iVar13;
    iVar7 = (int)(3 / (long)iVar13);
    iVar13 = iVar7 * iVar13;
    iVar8 = 4 - iVar13;
  }
  else {
    iVar9 = (iVar9 + 3) / iVar9;
    iVar15 = (int)(2 / (long)iVar9);
    iVar8 = 4 - iVar13;
    if (iVar8 <= iVar15) {
      iVar15 = (2 - iVar9 * iVar8) / iVar7 + iVar8;
    }
    if (iVar5 == iVar15) goto LAB_0011286d;
  }
  iVar15 = (int)(3 / (long)iVar9);
  if (iVar8 <= iVar15) {
    iVar15 = (3 - iVar8 * iVar9) / iVar7 + iVar8;
  }
  if (iVar5 != iVar15) {
    iVar15 = 0;
    if (3 < iVar13) {
      iVar15 = (((iVar13 + -4) * iVar9) / iVar7 - iVar13) + 4;
    }
    if (iVar5 != iVar15) {
      return 0;
    }
  }
  uVar4 = ref_node_local(ref_node,3,&local_98);
  if (uVar4 == 0) {
    uVar4 = ref_node_local(ref_node,0,&local_94);
    if (uVar4 == 0) {
      local_90[0] = 10;
      uVar4 = ref_cell_add(pRVar1->cell[0],&local_98,&local_9c);
      if (uVar4 == 0) {
        return 0;
      }
      pcVar14 = "add edg";
      uVar6 = 0x1e2;
    }
    else {
      pcVar14 = "loc";
      uVar6 = 0x1e0;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar6
           ,"ref_fixture_tri2_grid",(ulong)uVar4,pcVar14);
    return uVar4;
  }
  uVar17 = (ulong)uVar4;
  pcVar14 = "loc";
  uVar6 = 0x1df;
LAB_001129df:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar6,
         "ref_fixture_tri2_grid",uVar17,pcVar14);
  return (REF_STATUS)uVar17;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_tri2_grid(REF_GRID *ref_grid_ptr,
                                         REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnodesg = 4;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  ref_grid_twod(ref_grid) = REF_TRUE;

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 101;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 0.0, 1.0, 0.0);
    add_that_node(2, 1.0, 0.0, 0.0);

    RSS(ref_cell_add(ref_grid_tri(ref_grid), local, &cell), "add tri");
  }

  global[0] = 0;
  global[1] = 3;
  global[2] = 1;
  global[3] = 101;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, -1.0, 0.0, 0.0);
    add_that_node(2, 0.0, 1.0, 0.0);

    RSS(ref_cell_add(ref_grid_tri(ref_grid), local, &cell), "add tri");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  global[0] = 0;
  global[1] = 2;
  global[2] = 10;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    local[2] = global[2];
    RSS(ref_cell_add(ref_grid_edg(ref_grid), local, &cell), "add edg");
  }

  global[0] = 3;
  global[1] = 0;
  global[2] = 10;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    local[2] = global[2];
    RSS(ref_cell_add(ref_grid_edg(ref_grid), local, &cell), "add edg");
  }

  return REF_SUCCESS;
}